

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkUniversal.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkUniversal::Update(ChLinkUniversal *this,double time,bool update_assets)

{
  Scalar SVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar31;
  Scalar *pSVar32;
  ChConstraintTwoBodies *pCVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 local_268 [16];
  variable_if_dynamic<long,__1> local_258;
  double local_250;
  undefined8 local_248;
  ulong local_240;
  ulong uStack_238;
  undefined8 local_230;
  undefined8 local_228;
  ChVector<double> u1;
  ChMatrix33<double> Phi_pi2;
  ChVector<double> Phi_pi2_1;
  ChVector<double> Phi_pi1_1;
  ChVector<double> v2;
  ChMatrix33<double> Phi_pi1;
  ChFrame<double> frame2_abs;
  ChFrame<double> frame1_abs;
  
  ChLink::UpdateTime(&this->super_ChLink,time);
  ChFrame<double>::operator>>
            (&frame1_abs,&this->m_frame1,(ChFrame<double> *)(this->super_ChLink).Body1);
  ChFrame<double>::operator>>
            (&frame2_abs,&this->m_frame2,(ChFrame<double> *)(this->super_ChLink).Body2);
  local_268._8_8_ = &Phi_pi2;
  auVar34 = vsubpd_avx((undefined1  [16])frame2_abs.coord.pos.m_data._0_16_,
                       (undefined1  [16])frame1_abs.coord.pos.m_data._0_16_);
  *(undefined1 (*) [16])
   (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array =
       auVar34;
  (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]
       = frame2_abs.coord.pos.m_data[2] - frame1_abs.coord.pos.m_data[2];
  Phi_pi2.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
  Phi_pi2.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       (this->m_frame1).coord.pos.m_data[2];
  local_268._0_8_ =
       &(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix;
  auVar36._0_8_ =
       -Phi_pi2.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar36._8_8_ = 0x8000000000000000;
  Phi_pi2.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)vmovlpd_avx(auVar36);
  Phi_pi2.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = 0.0;
  auVar34 = *(undefined1 (*) [16])(this->m_frame1).coord.pos.m_data;
  Phi_pi2.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       (this->m_frame1).coord.pos.m_data[1];
  Phi_pi2.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       -auVar34._0_8_;
  Phi_pi2.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       -auVar34._8_8_;
  Phi_pi2.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       (double)vmovlpd_avx(auVar34);
  Phi_pi2.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&Phi_pi1,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)local_268);
  local_268._0_8_ = (non_const_type)0x0;
  local_250 = (this->m_frame2).coord.pos.m_data[2];
  u1.m_data[0] = (double)&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).
                          super_ChFrame<double>.Amatrix;
  auVar37._0_8_ = -local_250;
  auVar37._8_8_ = 0x8000000000000000;
  local_268._8_8_ = vmovlpd_avx(auVar37);
  local_248 = 0;
  auVar34 = *(undefined1 (*) [16])(this->m_frame2).coord.pos.m_data;
  local_258.m_value = (long)(this->m_frame2).coord.pos.m_data[1];
  local_240 = auVar34._0_8_ ^ 0x8000000000000000;
  uStack_238 = auVar34._8_8_ ^ 0x8000000000000000;
  local_230 = vmovlpd_avx(auVar34);
  local_228 = 0;
  u1.m_data[1] = (double)local_268;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&Phi_pi2,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&u1);
  pCVar33 = &this->m_cnstr_x;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,0);
  *pSVar32 = (Scalar)&DAT_bff0000000000000;
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,0);
  *pSVar32 = 1.0;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,1);
  *pSVar32 = 0.0;
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,1);
  *pSVar32 = 0.0;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,2);
  *pSVar32 = 0.0;
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,2);
  *pSVar32 = 0.0;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,3);
  dVar31 = Phi_pi2.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  *pSVar32 = Phi_pi1.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,3);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar31;
  auVar34._8_8_ = 0x8000000000000000;
  auVar34._0_8_ = 0x8000000000000000;
  auVar34 = vxorpd_avx512vl(auVar16,auVar34);
  *pSVar32 = auVar34._0_8_;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,4);
  dVar31 = Phi_pi2.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  *pSVar32 = Phi_pi1.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,4);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar31;
  auVar2._8_8_ = 0x8000000000000000;
  auVar2._0_8_ = 0x8000000000000000;
  auVar34 = vxorpd_avx512vl(auVar17,auVar2);
  *pSVar32 = auVar34._0_8_;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,5);
  dVar31 = Phi_pi2.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  *pSVar32 = Phi_pi1.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,5);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar31;
  pCVar33 = &this->m_cnstr_y;
  auVar3._8_8_ = 0x8000000000000000;
  auVar3._0_8_ = 0x8000000000000000;
  auVar34 = vxorpd_avx512vl(auVar18,auVar3);
  *pSVar32 = auVar34._0_8_;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,0);
  *pSVar32 = 0.0;
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,0);
  *pSVar32 = 0.0;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,1);
  *pSVar32 = (Scalar)&DAT_bff0000000000000;
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,1);
  *pSVar32 = 1.0;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,2);
  *pSVar32 = 0.0;
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,2);
  *pSVar32 = 0.0;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,3);
  dVar31 = Phi_pi2.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  *pSVar32 = Phi_pi1.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,3);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar31;
  auVar4._8_8_ = 0x8000000000000000;
  auVar4._0_8_ = 0x8000000000000000;
  auVar34 = vxorpd_avx512vl(auVar19,auVar4);
  *pSVar32 = auVar34._0_8_;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,4);
  dVar31 = Phi_pi2.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  *pSVar32 = Phi_pi1.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,4);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar31;
  auVar5._8_8_ = 0x8000000000000000;
  auVar5._0_8_ = 0x8000000000000000;
  auVar34 = vxorpd_avx512vl(auVar20,auVar5);
  *pSVar32 = auVar34._0_8_;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,5);
  dVar31 = Phi_pi2.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  *pSVar32 = Phi_pi1.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,5);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar31;
  pCVar33 = &this->m_cnstr_z;
  auVar6._8_8_ = 0x8000000000000000;
  auVar6._0_8_ = 0x8000000000000000;
  auVar34 = vxorpd_avx512vl(auVar21,auVar6);
  *pSVar32 = auVar34._0_8_;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,0);
  *pSVar32 = 0.0;
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,0);
  *pSVar32 = 0.0;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,1);
  *pSVar32 = 0.0;
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,1);
  *pSVar32 = 0.0;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,2);
  *pSVar32 = (Scalar)&DAT_bff0000000000000;
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,2);
  *pSVar32 = 1.0;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,3);
  dVar31 = Phi_pi2.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  *pSVar32 = Phi_pi1.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,3);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar31;
  auVar7._8_8_ = 0x8000000000000000;
  auVar7._0_8_ = 0x8000000000000000;
  auVar34 = vxorpd_avx512vl(auVar22,auVar7);
  *pSVar32 = auVar34._0_8_;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,4);
  dVar31 = Phi_pi2.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  *pSVar32 = Phi_pi1.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,4);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar31;
  auVar8._8_8_ = 0x8000000000000000;
  auVar8._0_8_ = 0x8000000000000000;
  auVar34 = vxorpd_avx512vl(auVar23,auVar8);
  *pSVar32 = auVar34._0_8_;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,5);
  dVar31 = Phi_pi2.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  *pSVar32 = Phi_pi1.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,5);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar31;
  Phi_pi2.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)&this->m_u1_tilde;
  auVar9._8_8_ = 0x8000000000000000;
  auVar9._0_8_ = 0x8000000000000000;
  auVar34 = vxorpd_avx512vl(auVar24,auVar9);
  *pSVar32 = auVar34._0_8_;
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       frame1_abs.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       frame2_abs.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar39._8_8_ = 0;
  auVar39._0_8_ =
       frame1_abs.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       frame2_abs.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  u1.m_data[0] = frame1_abs.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  u1.m_data[1] = frame1_abs.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  v2.m_data[0] = frame2_abs.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
  v2.m_data[1] = frame2_abs.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
  u1.m_data[2] = frame1_abs.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  v2.m_data[2] = frame2_abs.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
  auVar38._8_8_ = 0;
  auVar38._0_8_ =
       frame1_abs.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
       frame2_abs.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar34 = vfmadd231sd_fma(auVar38,auVar35,auVar40);
  auVar34 = vfmadd231sd_fma(auVar34,auVar39,auVar41);
  (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
       = auVar34._0_8_;
  Phi_pi2.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
                Amatrix;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&Phi_pi1,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&Phi_pi2);
  local_268._8_8_ = &this->m_v2_tilde;
  local_268._0_8_ =
       &(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&Phi_pi2,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)local_268);
  local_268._0_8_ = (PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&Phi_pi1;
  chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_268,&v2);
  local_268._0_8_ = (PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&Phi_pi2;
  chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_268,&u1);
  pCVar33 = &this->m_cnstr_dot;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,0);
  *pSVar32 = 0.0;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,1);
  *pSVar32 = 0.0;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,2);
  *pSVar32 = 0.0;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,3);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = Phi_pi1_1.m_data[0];
  auVar10._8_8_ = 0x8000000000000000;
  auVar10._0_8_ = 0x8000000000000000;
  auVar34 = vxorpd_avx512vl(auVar25,auVar10);
  *pSVar32 = auVar34._0_8_;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,4);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = Phi_pi1_1.m_data[1];
  auVar11._8_8_ = 0x8000000000000000;
  auVar11._0_8_ = 0x8000000000000000;
  auVar34 = vxorpd_avx512vl(auVar26,auVar11);
  *pSVar32 = auVar34._0_8_;
  ChConstraintTwoBodies::Get_Cq_a((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,5);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = Phi_pi1_1.m_data[2];
  auVar12._8_8_ = 0x8000000000000000;
  auVar12._0_8_ = 0x8000000000000000;
  auVar34 = vxorpd_avx512vl(auVar27,auVar12);
  *pSVar32 = auVar34._0_8_;
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,0);
  *pSVar32 = 0.0;
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,1);
  *pSVar32 = 0.0;
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,2);
  *pSVar32 = 0.0;
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,3);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = Phi_pi2_1.m_data[0];
  auVar13._8_8_ = 0x8000000000000000;
  auVar13._0_8_ = 0x8000000000000000;
  auVar34 = vxorpd_avx512vl(auVar28,auVar13);
  *pSVar32 = auVar34._0_8_;
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,4);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = Phi_pi2_1.m_data[1];
  auVar14._8_8_ = 0x8000000000000000;
  auVar14._0_8_ = 0x8000000000000000;
  auVar34 = vxorpd_avx512vl(auVar29,auVar14);
  *pSVar32 = auVar34._0_8_;
  ChConstraintTwoBodies::Get_Cq_b((ChRowVectorRef *)local_268,pCVar33);
  pSVar32 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)local_268,5);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = Phi_pi2_1.m_data[2];
  auVar15._8_8_ = 0x8000000000000000;
  auVar15._0_8_ = 0x8000000000000000;
  auVar34 = vxorpd_avx512vl(auVar30,auVar15);
  SVar1 = (Scalar)vmovlpd_avx(auVar34);
  *pSVar32 = SVar1;
  return;
}

Assistant:

void ChLinkUniversal::Update(double time, bool update_assets) {
    // Inherit time changes of parent class
    ChLink::UpdateTime(time);

    // Express the joint frames in absolute frame
    ChFrame<> frame1_abs = m_frame1 >> *Body1;
    ChFrame<> frame2_abs = m_frame2 >> *Body2;

    // Calculate violations of the spherical constraints
    m_C(0) = frame2_abs.coord.pos.x() - frame1_abs.coord.pos.x();
    m_C(1) = frame2_abs.coord.pos.y() - frame1_abs.coord.pos.y();
    m_C(2) = frame2_abs.coord.pos.z() - frame1_abs.coord.pos.z();

    // Compute Jacobian of the spherical constraints
    //    pos2_abs - pos1_abs = 0
    {
        ChMatrix33<> Phi_pi1 = Body1->GetA() * ChStarMatrix33<>(m_frame1.coord.pos);
        ChMatrix33<> Phi_pi2 = Body2->GetA() * ChStarMatrix33<>(m_frame2.coord.pos);

        m_cnstr_x.Get_Cq_a()(0) = -1;
        m_cnstr_x.Get_Cq_b()(0) = +1;
        m_cnstr_x.Get_Cq_a()(1) = 0;
        m_cnstr_x.Get_Cq_b()(1) = 0;
        m_cnstr_x.Get_Cq_a()(2) = 0;
        m_cnstr_x.Get_Cq_b()(2) = 0;
        m_cnstr_x.Get_Cq_a()(3) = Phi_pi1(0, 0);
        m_cnstr_x.Get_Cq_b()(3) = -Phi_pi2(0, 0);
        m_cnstr_x.Get_Cq_a()(4) = Phi_pi1(0, 1);
        m_cnstr_x.Get_Cq_b()(4) = -Phi_pi2(0, 1);
        m_cnstr_x.Get_Cq_a()(5) = Phi_pi1(0, 2);
        m_cnstr_x.Get_Cq_b()(5) = -Phi_pi2(0, 2);

        m_cnstr_y.Get_Cq_a()(0) = 0;
        m_cnstr_y.Get_Cq_b()(0) = 0;
        m_cnstr_y.Get_Cq_a()(1) = -1;
        m_cnstr_y.Get_Cq_b()(1) = +1;
        m_cnstr_y.Get_Cq_a()(2) = 0;
        m_cnstr_y.Get_Cq_b()(2) = 0;
        m_cnstr_y.Get_Cq_a()(3) = Phi_pi1(1, 0);
        m_cnstr_y.Get_Cq_b()(3) = -Phi_pi2(1, 0);
        m_cnstr_y.Get_Cq_a()(4) = Phi_pi1(1, 1);
        m_cnstr_y.Get_Cq_b()(4) = -Phi_pi2(1, 1);
        m_cnstr_y.Get_Cq_a()(5) = Phi_pi1(1, 2);
        m_cnstr_y.Get_Cq_b()(5) = -Phi_pi2(1, 2);

        m_cnstr_z.Get_Cq_a()(0) = 0;
        m_cnstr_z.Get_Cq_b()(0) = 0;
        m_cnstr_z.Get_Cq_a()(1) = 0;
        m_cnstr_z.Get_Cq_b()(1) = 0;
        m_cnstr_z.Get_Cq_a()(2) = -1;
        m_cnstr_z.Get_Cq_b()(2) = +1;
        m_cnstr_z.Get_Cq_a()(3) = Phi_pi1(2, 0);
        m_cnstr_z.Get_Cq_b()(3) = -Phi_pi2(2, 0);
        m_cnstr_z.Get_Cq_a()(4) = Phi_pi1(2, 1);
        m_cnstr_z.Get_Cq_b()(4) = -Phi_pi2(2, 1);
        m_cnstr_z.Get_Cq_a()(5) = Phi_pi1(2, 2);
        m_cnstr_z.Get_Cq_b()(5) = -Phi_pi2(2, 2);
    }

    // Calculate violation of the dot constraint
    ChVector<> u1 = frame1_abs.GetA().Get_A_Xaxis();
    ChVector<> v2 = frame2_abs.GetA().Get_A_Yaxis();

    m_C(3) = Vdot(u1, v2);

    // Compute Jacobian of the dot constraint
    //    dot(u1_abs, v2_abs) = 0
    {
        ChMatrix33<> mat1 = Body1->GetA() * m_u1_tilde;
        ChMatrix33<> mat2 = Body2->GetA() * m_v2_tilde;
        ChVector<> Phi_pi1 = mat1.transpose() * v2;
        ChVector<> Phi_pi2 = mat2.transpose() * u1;

        m_cnstr_dot.Get_Cq_a()(0) = 0;
        m_cnstr_dot.Get_Cq_a()(1) = 0;
        m_cnstr_dot.Get_Cq_a()(2) = 0;
        m_cnstr_dot.Get_Cq_a()(3) = -Phi_pi1.x();
        m_cnstr_dot.Get_Cq_a()(4) = -Phi_pi1.y();
        m_cnstr_dot.Get_Cq_a()(5) = -Phi_pi1.z();

        m_cnstr_dot.Get_Cq_b()(0) = 0;
        m_cnstr_dot.Get_Cq_b()(1) = 0;
        m_cnstr_dot.Get_Cq_b()(2) = 0;
        m_cnstr_dot.Get_Cq_b()(3) = -Phi_pi2.x();
        m_cnstr_dot.Get_Cq_b()(4) = -Phi_pi2.y();
        m_cnstr_dot.Get_Cq_b()(5) = -Phi_pi2.z();
    }
}